

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2-arch.c
# Opt level: O2

void fill_segment_default(argon2_instance_t *instance,argon2_position_t position)

{
  block *pbVar1;
  bool bVar2;
  uint32_t uVar3;
  uint64_t *puVar4;
  ulong uVar5;
  undefined8 extraout_RDX;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  argon2_position_t local_c50;
  undefined4 local_c3c;
  ulong local_c38;
  block local_c30;
  block input_block;
  block address_block;
  
  uVar5 = position._8_8_;
  uVar7 = position._0_8_;
  if (instance != (argon2_instance_t *)0x0) {
    local_c50._0_8_ = uVar7;
    local_c50._8_8_ = uVar5;
    if ((instance->type == Argon2_i) ||
       (position.slice < 2 && (instance->type == Argon2_id && position.pass == 0))) {
      init_block_value(&local_c30,'\0');
      init_block_value(&input_block,'\0');
      input_block.v[0] = uVar7 & 0xffffffff;
      input_block.v[2] = uVar5 & 0xff;
      input_block.v[3] = (uint64_t)instance->memory_blocks;
      input_block.v[4] = (uint64_t)instance->passes;
      input_block.v[5] = (uint64_t)instance->type;
      local_c3c = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      input_block.v[1] = uVar7 >> 0x20;
    }
    else {
      local_c3c = 0;
    }
    bVar2 = position.slice == 0 && position.pass == 0;
    if ((bVar2 & (byte)local_c3c) == 1) {
      next_addresses(&address_block,&input_block,&local_c30);
      uVar6 = 2;
    }
    else {
      uVar6 = (uint)bVar2 * 2;
    }
    uVar8 = instance->segment_length;
    uVar9 = instance->lane_length;
    uVar10 = position.lane * uVar9 + uVar6 + (position._8_4_ & 0xff) * uVar8;
    uVar9 = (-(uint)(uVar10 % uVar9 != 0) | uVar9 - 1) + uVar10;
    while( true ) {
      local_c38 = (ulong)uVar10;
      if (uVar8 <= uVar6) break;
      if (uVar10 % instance->lane_length == 1) {
        uVar9 = uVar10 - 1;
      }
      if ((char)local_c3c == '\0') {
        puVar4 = instance->memory[uVar9].v;
      }
      else {
        if ((uVar6 & 0x7f) == 0) {
          next_addresses(&address_block,&input_block,&local_c30);
        }
        puVar4 = address_block.v + (uVar6 & 0x7f);
      }
      uVar5 = (*puVar4 >> 0x20) % (ulong)instance->lanes;
      uVar8 = 0;
      uVar7 = uVar5;
      if (local_c50.slice == '\0') {
        uVar7 = (ulong)local_c50._0_8_ >> 0x20;
      }
      if (local_c50.pass != 0) {
        uVar7 = uVar5;
      }
      local_c50.index = uVar6;
      uVar3 = index_alpha(instance,&local_c50,(uint32_t)*puVar4,
                          (uint)(uVar7 == (ulong)local_c50._0_8_ >> 0x20));
      pbVar1 = instance->memory;
      if (local_c50.pass != 0) {
        uVar8 = (uint)(instance->version != 0x10);
      }
      iVar11 = (int)local_c38;
      fill_block(pbVar1 + uVar9,pbVar1 + uVar7 * instance->lane_length + (ulong)uVar3,
                 pbVar1 + (local_c38 & 0xffffffff),uVar8);
      uVar6 = uVar6 + 1;
      uVar10 = iVar11 + 1;
      uVar9 = uVar9 + 1;
      uVar8 = instance->segment_length;
    }
  }
  return;
}

Assistant:

void fill_segment_default(const argon2_instance_t *instance,
                          argon2_position_t position)
{
    fill_segment_64(instance, position);
}